

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roipooling.cpp
# Opt level: O1

int __thiscall
ncnn::ROIPooling::forward
          (ROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint _c;
  uint uVar5;
  pointer pMVar6;
  Mat *this_00;
  float *pfVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ulong local_b0;
  void *local_a8;
  void *local_98;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = pMVar6->w;
  uVar15 = (ulong)(int)uVar3;
  uVar4 = pMVar6->h;
  _c = pMVar6->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->pooled_width,this->pooled_height,_c,pMVar6->elemsize,opt->blob_allocator
             );
  iVar12 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pfVar7 = (float *)pMVar6[1].data;
    fVar31 = this->spatial_scale;
    fVar28 = roundf(*pfVar7 * fVar31);
    fVar29 = roundf(pfVar7[1] * fVar31);
    fVar30 = roundf(pfVar7[2] * fVar31);
    fVar31 = roundf(fVar31 * pfVar7[3]);
    iVar20 = (int)fVar30 - (int)fVar28;
    iVar12 = 0;
    if (iVar20 < 1) {
      iVar20 = 0;
    }
    iVar16 = (int)fVar31 - (int)fVar29;
    if (iVar16 < 1) {
      iVar16 = 0;
    }
    if (0 < (int)_c) {
      fVar30 = (float)(iVar20 + 1) / (float)this->pooled_width;
      fVar32 = (float)(iVar16 + 1) / (float)this->pooled_height;
      pvVar8 = pMVar6->data;
      lVar17 = pMVar6->cstep * pMVar6->elemsize;
      pvVar9 = this_00->data;
      sVar10 = this_00->cstep;
      sVar11 = this_00->elemsize;
      uVar5 = this->pooled_width;
      iVar12 = this->pooled_height;
      fVar31 = (float)(int)fVar29;
      fVar28 = (float)(int)fVar28;
      local_b0 = 0;
      local_a8 = pvVar8;
      do {
        if (0 < iVar12) {
          local_98 = (void *)(sVar10 * sVar11 * local_b0 + (long)pvVar9);
          iVar20 = 0;
          do {
            if (0 < (int)uVar5) {
              fVar29 = floorf((float)iVar20 * fVar32);
              uVar26 = (uint)(fVar29 + fVar31);
              fVar29 = ceilf((float)(iVar20 + 1) * fVar32);
              uVar24 = (uint)(fVar29 + fVar31);
              if ((int)uVar26 < 1) {
                uVar26 = 0;
              }
              uVar13 = uVar26;
              if ((int)uVar4 < (int)uVar26) {
                uVar13 = uVar4;
              }
              if ((int)uVar24 < 1) {
                uVar24 = 0;
              }
              if ((int)uVar4 < (int)uVar24) {
                uVar24 = uVar4;
              }
              uVar18 = (long)(int)uVar4;
              if ((long)(ulong)uVar26 < (long)(int)uVar4) {
                uVar18 = (ulong)uVar26;
              }
              uVar25 = 0;
              do {
                fVar29 = floorf((float)(int)uVar25 * fVar30);
                uVar27 = (uint)(fVar29 + fVar28);
                uVar1 = uVar25 + 1;
                fVar29 = ceilf((float)(int)uVar1 * fVar30);
                uVar14 = (uint)(fVar29 + fVar28);
                if ((int)uVar27 < 1) {
                  uVar27 = 0;
                }
                uVar21 = uVar27;
                if ((int)uVar3 < (int)uVar27) {
                  uVar21 = uVar3;
                }
                if ((int)uVar14 < 1) {
                  uVar14 = 0;
                }
                if ((int)uVar3 < (int)uVar14) {
                  uVar14 = uVar3;
                }
                fVar29 = 0.0;
                if (((int)uVar26 < (int)uVar24) && ((int)uVar27 < (int)uVar14)) {
                  fVar29 = *(float *)((long)pvVar8 +
                                     (long)(int)(uVar13 * uVar3 + uVar21) * 4 + lVar17 * local_b0);
                }
                if ((int)uVar26 < (int)uVar24) {
                  uVar22 = (ulong)uVar27;
                  if ((long)uVar15 <= (long)(ulong)uVar27) {
                    uVar22 = uVar15;
                  }
                  lVar19 = (long)local_a8 + uVar22 * 4 + uVar15 * 4 * uVar18;
                  uVar22 = uVar18;
                  do {
                    if ((int)uVar27 < (int)uVar14) {
                      lVar23 = 0;
                      do {
                        fVar2 = *(float *)(lVar19 + lVar23 * 4);
                        if (fVar29 <= fVar2) {
                          fVar29 = fVar2;
                        }
                        lVar23 = lVar23 + 1;
                      } while (uVar14 - uVar21 != (int)lVar23);
                    }
                    uVar22 = uVar22 + 1;
                    lVar19 = lVar19 + uVar15 * 4;
                  } while (((int)uVar18 + uVar24) - uVar13 != (int)uVar22);
                }
                *(float *)((long)local_98 + uVar25 * 4) = fVar29;
                uVar25 = uVar1;
              } while (uVar1 != uVar5);
            }
            local_98 = (void *)((long)local_98 + (long)(int)uVar5 * 4);
            iVar20 = iVar20 + 1;
          } while (iVar20 != iVar12);
        }
        local_b0 = local_b0 + 1;
        local_a8 = (void *)((long)local_a8 + lVar17);
      } while (local_b0 != _c);
      iVar12 = 0;
    }
  }
  return iVar12;
}

Assistant:

int ROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    int roi_x1 = round(roi_ptr[0] * spatial_scale);
    int roi_y1 = round(roi_ptr[1] * spatial_scale);
    int roi_x2 = round(roi_ptr[2] * spatial_scale);
    int roi_y2 = round(roi_ptr[3] * spatial_scale);

    int roi_w = std::max(roi_x2 - roi_x1 + 1, 1);
    int roi_h = std::max(roi_y2 - roi_y1 + 1, 1);

    float bin_size_w = (float)roi_w / (float)pooled_width;
    float bin_size_h = (float)roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                // Compute pooling region for this output unit:
                //  start (included) = floor(ph * roi_height / pooled_height)
                //  end (excluded) = ceil((ph + 1) * roi_height / pooled_height)
                int hstart = roi_y1 + floor((float)(ph) * bin_size_h);
                int wstart = roi_x1 + floor((float)(pw) * bin_size_w);
                int hend = roi_y1 + ceil((float)(ph + 1) * bin_size_h);
                int wend = roi_x1 + ceil((float)(pw + 1) * bin_size_w);

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);

                float max = is_empty ? 0.f : ptr[hstart * w + wstart];

                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        max = std::max(max, ptr[index]);
                    }
                }

                outptr[pw] = max;
            }

            outptr += pooled_width;
        }
    }

    return 0;
}